

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool __thiscall Min2<1>::propagate(Min2<1> *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  IntVar *pIVar5;
  IntVar *pIVar6;
  ulong uVar7;
  int iVar8;
  IntVar *pIVar9;
  long lVar10;
  TrailElem local_28;
  
  pIVar6 = (this->x).var;
  pIVar9 = (this->z).var;
  iVar3 = (pIVar6->min).v;
  iVar2 = (pIVar9->min).v;
  if (iVar2 < iVar3) {
    if (so.lazy) {
      iVar2 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[8])(pIVar6);
      lVar10 = (long)iVar2 * 4 + 2;
      pIVar9 = (this->z).var;
    }
    else {
      lVar10 = 0;
    }
    iVar3 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xe])(pIVar9,(long)iVar3,lVar10,1)
    ;
    if ((char)iVar3 != '\0') {
      pIVar9 = (this->z).var;
      iVar2 = (pIVar9->min).v;
      goto LAB_001af5ea;
    }
LAB_001af798:
    bVar1 = false;
  }
  else {
LAB_001af5ea:
    pIVar6 = (this->y).var;
    iVar3 = (pIVar6->min).v;
    if (iVar2 < iVar3) {
      if (so.lazy == true) {
        iVar2 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[8])(pIVar6);
        lVar10 = (long)iVar2 * 4 + 2;
        pIVar9 = (this->z).var;
      }
      else {
        lVar10 = 0;
      }
      iVar3 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xe])
                        (pIVar9,(long)iVar3,lVar10,1);
      if ((char)iVar3 == '\0') goto LAB_001af798;
      pIVar6 = (this->y).var;
      pIVar9 = (this->z).var;
    }
    pIVar5 = (this->x).var;
    iVar2 = (pIVar5->max).v;
    iVar3 = (pIVar6->max).v;
    if (iVar3 < iVar2) {
      iVar3 = iVar2;
    }
    iVar8 = (pIVar9->max).v;
    if (iVar3 < iVar8) {
      lVar10 = (long)iVar3;
      if (so.lazy == true) {
        iVar3 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xc])(pIVar5,lVar10);
        pIVar6 = (this->y).var;
        uVar4 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[0xc])(pIVar6,lVar10);
        uVar7 = (ulong)uVar4 << 0x20 | (long)iVar3 << 2 | 3;
        pIVar9 = (this->z).var;
      }
      else {
        uVar7 = 0;
      }
      iVar3 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xf])(pIVar9,lVar10,uVar7,1);
      if ((char)iVar3 == '\0') goto LAB_001af798;
      pIVar5 = (this->x).var;
      pIVar9 = (this->z).var;
      iVar8 = (pIVar9->max).v;
      iVar2 = (pIVar5->max).v;
    }
    if (iVar8 < iVar2) {
      if (so.lazy == true) {
        iVar3 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[9])();
        lVar10 = (long)iVar3 * 4 + 2;
        pIVar5 = (this->x).var;
      }
      else {
        lVar10 = 0;
      }
      iVar3 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xf])
                        (pIVar5,(long)iVar8,lVar10,1);
      if ((char)iVar3 == '\0') goto LAB_001af798;
      pIVar9 = (this->z).var;
      iVar8 = (pIVar9->max).v;
    }
    pIVar6 = (this->y).var;
    if (iVar8 < (pIVar6->max).v) {
      if (so.lazy == true) {
        iVar3 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[9])();
        lVar10 = (long)iVar3 * 4 + 2;
        pIVar6 = (this->y).var;
      }
      else {
        lVar10 = 0;
      }
      iVar3 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[0xf])
                        (pIVar6,(long)iVar8,lVar10,1);
      if ((char)iVar3 == '\0') goto LAB_001af798;
      iVar8 = (((this->z).var)->max).v;
    }
    if (((((this->x).var)->min).v == iVar8) || (bVar1 = true, (((this->y).var)->min).v == iVar8)) {
      local_28.pt = (int *)&(this->super_Propagator).satisfied;
      local_28.x = (int)(this->super_Propagator).satisfied.v;
      local_28.sz = 1;
      vec<TrailElem>::push(&engine.trail,&local_28);
      (this->super_Propagator).satisfied.v = '\x01';
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool propagate() override {
		// make a less than or equal to min(max(b_i))

		setDom(z, setMax, x.getMax(), x.getMaxLit());
		setDom(z, setMax, y.getMax(), y.getMaxLit());

		const int64_t m = (x.getMin() < y.getMin() ? x.getMin() : y.getMin());
		setDom(z, setMin, m, x.getFMinLit(m), y.getFMinLit(m));

		setDom(x, setMin, z.getMin(), z.getMinLit());
		setDom(y, setMin, z.getMin(), z.getMinLit());

		if (z.getMin() == x.getMax() || z.getMin() == y.getMax()) {
			satisfied = true;
		}

		return true;
	}